

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.c
# Opt level: O0

expr_t * expr_new_op(int symbol,expr_t **children,int ver)

{
  operation_t *poVar1;
  int local_3c;
  int ind;
  expr_t *ret;
  operation_t *op;
  int ver_local;
  expr_t **children_local;
  expr_t *peStack_10;
  int symbol_local;
  
  poVar1 = op_get(symbol,ver);
  if (poVar1 == (operation_t *)0x0) {
    peStack_10 = (expr_t *)0x0;
  }
  else {
    peStack_10 = expr_new(EXPR_OP);
    peStack_10->op = poVar1;
    for (local_3c = 0; children[local_3c] != (expr_t *)0x0; local_3c = local_3c + 1) {
      list_append_new(&peStack_10->children,children[local_3c]);
    }
  }
  return peStack_10;
}

Assistant:

expr_t*
expr_new_op(
    int symbol,
    expr_t* children[],
    int ver
) {
    const operation_t* op = op_get(symbol, ver);
    if (!op)
        return NULL;

    expr_t* ret = expr_new(EXPR_OP);
    ret->op = op;

    int ind = 0;
    while(children[ind]) {
        list_append_new(&ret->children, children[ind]);
        ++ind;
    }

    return ret;
}